

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O0

void ssllabs::Endpoint::parseSimulationResults(ConstObject *obj,labsSimulation_t *labsSimulation)

{
  bool bVar1;
  int iVar2;
  ValueType *pVVar3;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_20;
  labsSimulation_t *labsSimulation_local;
  ConstObject *obj_local;
  
  local_20.data_.o.members = (Member *)labsSimulation;
  labsSimulation_local = (labsSimulation_t *)obj;
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember(obj,"errorCode");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)labsSimulation_local,"errorCode");
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsInt(pVVar3);
    if (bVar1) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)labsSimulation_local,"errorCode");
      iVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(pVVar3);
      *(int *)(local_20.data_.s.str + 0x70) = iVar2;
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                       *)labsSimulation_local,"attempts");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)labsSimulation_local,"attempts");
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsInt(pVVar3);
    if (bVar1) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)labsSimulation_local,"attempts");
      iVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(pVVar3);
      *(int *)(local_20.data_.s.str + 0x74) = iVar2;
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                       *)labsSimulation_local,"protocolId");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)labsSimulation_local,"protocolId");
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsInt(pVVar3);
    if (bVar1) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)labsSimulation_local,"protocolId");
      iVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(pVVar3);
      *(int *)(local_20.data_.s.str + 0x78) = iVar2;
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                       *)labsSimulation_local,"suiteId");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)labsSimulation_local,"suiteId");
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsInt(pVVar3);
    if (bVar1) {
      pVVar3 = rapidjson::
               GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
               ::operator[]<char_const>
                         ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                           *)labsSimulation_local,"suiteId");
      iVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetInt(pVVar3);
      *(int *)(local_20.data_.s.str + 0x7c) = iVar2;
    }
  }
  bVar1 = rapidjson::
          GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                       *)labsSimulation_local,"client");
  if (bVar1) {
    pVVar3 = rapidjson::
             GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
             ::operator[]<char_const>
                       ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                         *)labsSimulation_local,"client");
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsObject(pVVar3);
    if (bVar1) {
      rapidjson::
      GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
      ::operator[]<char_const>
                ((GenericObject<true,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                  *)labsSimulation_local,"client");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetObject(&local_20);
      parseSimulationClient((ConstObject *)&local_20,(labsSimClient_t *)local_20.data_.o.members);
      rapidjson::
      GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
      ::~GenericObject((GenericObject<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                        *)&local_20);
    }
  }
  return;
}

Assistant:

void Endpoint::parseSimulationResults(const rapidjson::GenericValue<rapidjson::UTF8<char>,
            rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::ConstObject &obj,
                                    labsSimulation_t &labsSimulation) {

        if (obj.HasMember("errorCode") && obj["errorCode"].IsInt()) {
            labsSimulation.ErrorCode = obj["errorCode"].GetInt();
        }

        if (obj.HasMember("attempts") && obj["attempts"].IsInt()) {
            labsSimulation.Attempts = obj["attempts"].GetInt();
        }

        if (obj.HasMember("protocolId") && obj["protocolId"].IsInt()) {
            labsSimulation.ProtocolId = obj["protocolId"].GetInt();
        }

        if (obj.HasMember("suiteId") && obj["suiteId"].IsInt()) {
            labsSimulation.SuiteId = obj["suiteId"].GetInt();
        }

        if (obj.HasMember("client") && obj["client"].IsObject()) {
            parseSimulationClient(obj["client"].GetObject(), labsSimulation.Client);
        }
    }